

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O2

void __thiscall benchmark::internal::BenchmarkImp::Range(BenchmarkImp *this,int start,int limit)

{
  pointer piVar1;
  int iVar2;
  pointer piVar3;
  initializer_list<int> __l;
  allocator_type local_6d;
  int local_6c;
  vector<int,_std::allocator<int>_> arglist;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  iVar2 = ArgsCnt(this);
  if (iVar2 != -1) {
    iVar2 = ArgsCnt(this);
    if (iVar2 != 1) {
      CheckHandler::CheckHandler
                ((CheckHandler *)&arglist,"ArgsCnt() == -1 || ArgsCnt() == 1",
                 "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
                 ,"Range",0x20d);
      CheckHandler::~CheckHandler((CheckHandler *)&arglist);
    }
  }
  GetNullLogInstance();
  arglist.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  arglist.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  arglist.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  AddRange(&arglist,start,limit,this->range_multiplier_);
  piVar1 = arglist.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (piVar3 = arglist.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar3 != piVar1; piVar3 = piVar3 + 1) {
    local_6c = *piVar3;
    __l._M_len = 1;
    __l._M_array = &local_6c;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_48,__l,&local_6d);
    std::
    vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
    ::emplace_back<std::vector<int,std::allocator<int>>>
              ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                *)&this->args_,(vector<int,_std::allocator<int>_> *)&local_48);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&arglist.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void BenchmarkImp::Range(int start, int limit) {
  CHECK(ArgsCnt() == -1 || ArgsCnt() == 1);
  std::vector<int> arglist;
  AddRange(&arglist, start, limit, range_multiplier_);

  for (int i : arglist) {
    args_.push_back({i});
  }
}